

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O3

bool __thiscall pstore::broker::gc_watch_thread::stop_vacuum(gc_watch_thread *this,string *path)

{
  long lVar1;
  undefined8 *puVar2;
  not_null<const_char_*> nVar3;
  int *piVar4;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar5;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_1;
  long *in_FS_OFFSET;
  maybe<int,_void> pid;
  maybe<int,_void> local_48;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  get_pid(&local_48,this,path);
  if (local_48.valid_ == true) {
    local_38.ptr_ = (path->_M_dataplus)._M_p;
    gsl::not_null<const_char_*>::ensure_invariant(&local_38);
    nVar3.ptr_ = local_38.ptr_;
    pstore::details::log_destinations::__tls_init();
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar5 = *(undefined8 **)(lVar1 + -8);
      puVar2 = (undefined8 *)puVar5[1];
      for (puVar5 = (undefined8 *)*puVar5; puVar5 != puVar2; puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)*puVar5 + 0x58))((long *)*puVar5,6,"Killing GC for ",nVar3.ptr_);
      }
    }
    piVar4 = maybe<int,_void>::operator->(&local_48);
    (*this->_vptr_gc_watch_thread[3])(this,piVar4);
    bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>>::
    erasel<std::__cxx11::string>
              ((bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>> *)
               &this->processes_,path);
  }
  else {
    local_40.ptr_ = (path->_M_dataplus)._M_p;
    gsl::not_null<const_char_*>::ensure_invariant(&local_40);
    nVar3.ptr_ = local_40.ptr_;
    pstore::details::log_destinations::__tls_init();
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar5 = *(undefined8 **)(lVar1 + -8);
      puVar2 = (undefined8 *)puVar5[1];
      for (puVar5 = (undefined8 *)*puVar5; puVar5 != puVar2; puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)*puVar5 + 0x58))
                  ((long *)*puVar5,6,"No GC process running for ",nVar3.ptr_);
      }
    }
  }
  return local_48.valid_;
}

Assistant:

bool gc_watch_thread::stop_vacuum (std::string const & path) {
            if (maybe<process_identifier> const pid = this->get_pid (path)) {
                log (priority::info, "Killing GC for ", logger::quoted{path.c_str ()});
                this->kill (*pid);
                processes_.erasel (path);
                return true;
            }
            log (priority::info, "No GC process running for ", logger::quoted{path.c_str ()});
            return false;
        }